

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters
          (NetworkUpdateParameters *this,NetworkUpdateParameters *from)

{
  bool bVar1;
  InternalMetadataWithArenaLite *this_00;
  Optimizer *this_01;
  BoolParameter *this_02;
  Int64Parameter *pIVar2;
  NetworkUpdateParameters *from_local;
  NetworkUpdateParameters *this_local;
  string *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__NetworkUpdateParameters_00572ed8
  ;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::RepeatedPtrField
            (&this->losslayers_,&from->losslayers_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = (string *)
                 google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,local_20);
  }
  bVar1 = has_optimizer(from);
  if (bVar1) {
    this_01 = (Optimizer *)operator_new(0x20);
    Optimizer::Optimizer(this_01,from->optimizer_);
    this->optimizer_ = this_01;
  }
  else {
    this->optimizer_ = (Optimizer *)0x0;
  }
  bVar1 = has_epochs(from);
  if (bVar1) {
    pIVar2 = (Int64Parameter *)operator_new(0x28);
    Int64Parameter::Int64Parameter(pIVar2,from->epochs_);
    this->epochs_ = pIVar2;
  }
  else {
    this->epochs_ = (Int64Parameter *)0x0;
  }
  bVar1 = has_shuffle(from);
  if (bVar1) {
    this_02 = (BoolParameter *)operator_new(0x18);
    BoolParameter::BoolParameter(this_02,from->shuffle_);
    this->shuffle_ = this_02;
  }
  else {
    this->shuffle_ = (BoolParameter *)0x0;
  }
  bVar1 = has_seed(from);
  if (bVar1) {
    pIVar2 = (Int64Parameter *)operator_new(0x28);
    Int64Parameter::Int64Parameter(pIVar2,from->seed_);
    this->seed_ = pIVar2;
  }
  else {
    this->seed_ = (Int64Parameter *)0x0;
  }
  return;
}

Assistant:

NetworkUpdateParameters::NetworkUpdateParameters(const NetworkUpdateParameters& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      losslayers_(from.losslayers_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_optimizer()) {
    optimizer_ = new ::CoreML::Specification::Optimizer(*from.optimizer_);
  } else {
    optimizer_ = NULL;
  }
  if (from.has_epochs()) {
    epochs_ = new ::CoreML::Specification::Int64Parameter(*from.epochs_);
  } else {
    epochs_ = NULL;
  }
  if (from.has_shuffle()) {
    shuffle_ = new ::CoreML::Specification::BoolParameter(*from.shuffle_);
  } else {
    shuffle_ = NULL;
  }
  if (from.has_seed()) {
    seed_ = new ::CoreML::Specification::Int64Parameter(*from.seed_);
  } else {
    seed_ = NULL;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.NetworkUpdateParameters)
}